

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

int __thiscall
fmt::v10::detail::compile_parse_context<char>::next_arg_id(compile_parse_context<char> *this)

{
  int iVar1;
  
  iVar1 = (this->super_basic_format_parse_context<char>).next_arg_id_;
  if (iVar1 < 0) {
    throw_format_error("cannot switch from manual to automatic argument indexing");
  }
  (this->super_basic_format_parse_context<char>).next_arg_id_ = iVar1 + 1;
  if (iVar1 < *(int *)&(this->super_basic_format_parse_context<char>).field_0x14) {
    return iVar1;
  }
  throw_format_error("argument not found");
}

Assistant:

FMT_CONSTEXPR auto next_arg_id() -> int {
    int id = base::next_arg_id();
    if (id >= num_args_) throw_format_error("argument not found");
    return id;
  }